

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

float trng::math::detail::inv_Phi_approx<float>(float x)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  
  if ((x < 0.0) || (1.0 < x)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    fVar2 = NAN;
  }
  else if ((x != 0.0) || (NAN(x))) {
    if ((x != 1.0) || (NAN(x))) {
      if (0.02425 <= x) {
        if (0.97575 <= x) {
          fVar2 = log1pf(-x);
          fVar2 = fVar2 * -2.0;
          if (fVar2 < 0.0) {
            fVar2 = sqrtf(fVar2);
          }
          else {
            fVar2 = SQRT(fVar2);
          }
          fVar2 = -(((((fVar2 * -0.007784894 + -0.32239646) * fVar2 + -2.4007583) * fVar2 +
                     -2.5497324) * fVar2 + 4.3746643) * fVar2 + 2.938164) /
                  ((((fVar2 * 0.007784696 + 0.32246712) * fVar2 + 2.4451342) * fVar2 + 3.7544086) *
                   fVar2 + 1.0);
        }
        else {
          fVar2 = x + -0.5;
          fVar3 = fVar2 * fVar2;
          fVar2 = ((((((fVar3 * -39.69683 + 220.9461) * fVar3 + -275.9285) * fVar3 + 138.35776) *
                     fVar3 + -30.664799) * fVar3 + 2.5066283) * fVar2) /
                  (((((fVar3 * -54.476097 + 161.58583) * fVar3 + -155.69897) * fVar3 + 66.801315) *
                    fVar3 + -13.280682) * fVar3 + 1.0);
        }
      }
      else {
        fVar2 = logf(x);
        fVar2 = fVar2 * -2.0;
        if (fVar2 < 0.0) {
          fVar2 = sqrtf(fVar2);
        }
        else {
          fVar2 = SQRT(fVar2);
        }
        fVar2 = (((((fVar2 * -0.007784894 + -0.32239646) * fVar2 + -2.4007583) * fVar2 + -2.5497324)
                  * fVar2 + 4.3746643) * fVar2 + 2.938164) /
                ((((fVar2 * 0.007784696 + 0.32246712) * fVar2 + 2.4451342) * fVar2 + 3.7544086) *
                 fVar2 + 1.0);
      }
    }
    else {
      fVar2 = INFINITY;
    }
  }
  else {
    fVar2 = -INFINITY;
  }
  return fVar2;
}

Assistant:

TRNG_CUDA_ENABLE T inv_Phi_approx(T x) {
        using traits = inv_Phi_traits<T>;
        if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::quiet_NaN();
        }
        if (x == 0)
          return -numeric_limits<T>::infinity();
        if (x == 1)
          return numeric_limits<T>::infinity();
        if (x < traits::x_low) {
          // rational approximation for lower region
          const T q{sqrt(-2 * ln(x))};
          return (((((traits::c[0] * q + traits::c[1]) * q + traits::c[2]) * q + traits::c[3]) *
                       q +
                   traits::c[4]) *
                      q +
                  traits::c[5]) /
                 ((((traits::d[0] * q + traits::d[1]) * q + traits::d[2]) * q + traits::d[3]) *
                      q +
                  1);
        } else if (x < traits::x_high) {
          // rational approximation for central region
          const T q{x - traits::one_half};
          const T r{q * q};
          return (((((traits::a[0] * r + traits::a[1]) * r + traits::a[2]) * r + traits::a[3]) *
                       r +
                   traits::a[4]) *
                      r +
                  traits::a[5]) *
                 q /
                 (((((traits::b[0] * r + traits::b[1]) * r + traits::b[2]) * r + traits::b[3]) *
                       r +
                   traits::b[4]) *
                      r +
                  1);
        } else {
          // rational approximation for upper region
          const T q{sqrt(-2 * ln1p(-x))};
          return -(((((traits::c[0] * q + traits::c[1]) * q + traits::c[2]) * q +
                     traits::c[3]) *
                        q +
                    traits::c[4]) *
                       q +
                   traits::c[5]) /
                 ((((traits::d[0] * q + traits::d[1]) * q + traits::d[2]) * q + traits::d[3]) *
                      q +
                  1);
        }
      }